

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_client_hello_get_extension
               (SSL_CLIENT_HELLO *client_hello,CBS *out,uint16_t extension_type)

{
  int iVar1;
  uint16_t type;
  CBS extension;
  CBS extensions;
  uint16_t local_4a;
  CBS local_48;
  CBS local_38;
  
  local_38.data = client_hello->extensions;
  local_38.len = client_hello->extensions_len;
  while (((local_38.len != 0 && (iVar1 = CBS_get_u16(&local_38,&local_4a), iVar1 != 0)) &&
         (iVar1 = CBS_get_u16_length_prefixed(&local_38,&local_48), iVar1 != 0))) {
    if (local_4a == extension_type) {
      out->data = local_48.data;
      out->len = local_48.len;
      return true;
    }
  }
  return false;
}

Assistant:

bool ssl_client_hello_get_extension(const SSL_CLIENT_HELLO *client_hello,
                                    CBS *out, uint16_t extension_type) {
  CBS extensions;
  CBS_init(&extensions, client_hello->extensions, client_hello->extensions_len);
  while (CBS_len(&extensions) != 0) {
    // Decode the next extension.
    uint16_t type;
    CBS extension;
    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      return false;
    }

    if (type == extension_type) {
      *out = extension;
      return true;
    }
  }

  return false;
}